

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O1

uint randomMT(void)

{
  int iVar1;
  uint uVar2;
  time_t tVar3;
  uint i;
  long lVar4;
  int iVar5;
  
  iVar5 = next;
  iVar1 = next + 1;
  if ((0x26e < next) && (iVar1 = 0, next != 0x26f)) {
    iVar5 = 0;
    next = next + 1;
    tVar3 = time((time_t *)0x0);
    uVar2 = (int)tVar3 + 0x1571;
    lVar4 = 1;
    state[0] = uVar2;
    do {
      uVar2 = (uVar2 >> 0x1e ^ uVar2) * 0x6c078965 + (int)lVar4;
      state[lVar4] = uVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    iVar1 = 1;
  }
  next = iVar1;
  iVar1 = iVar5 + 0x18d;
  if (0xe2 < iVar5) {
    iVar1 = iVar5 + -0xe3;
  }
  uVar2 = -(state[next] & 1) & 0x9908b0df ^
          (state[next] & 0x7ffffffe | state[iVar5] & 0x80000000) >> 1 ^ state[iVar1];
  state[iVar5] = uVar2;
  uVar2 = uVar2 >> 0xb ^ uVar2;
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

uint randomMT()
{
    int cur = next;
    if(++next >= N)
    {
        if(next > N) { seedMT(5489U + time(NULL)); cur = next++; }
        else next = 0;
    }
    uint y = (state[cur] & 0x80000000U) | (state[next] & 0x7FFFFFFFU);
    state[cur] = y = state[cur < N-M ? cur + M : cur + M-N] ^ (y >> 1) ^ (-int(y & 1U) & K);
    y ^= (y >> 11);
    y ^= (y <<  7) & 0x9D2C5680U;
    y ^= (y << 15) & 0xEFC60000U;
    y ^= (y >> 18);
    return y;
}